

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrNewSceneComputeInfoMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  uint32_t value_requestedfeatures_inc;
  ulong uVar6;
  allocator local_451;
  string *local_450;
  string bounds_prefix;
  string consistency_prefix;
  string requestedfeatures_prefix;
  string type_prefix;
  string requestedfeaturecount_prefix;
  string next_prefix;
  undefined1 local_388 [32];
  string local_368;
  string local_348;
  ostringstream oss_requestedFeatureCount;
  ostringstream oss_requestedFeatures_array;
  uint auStack_190 [88];
  
  PointerToHexString<XrNewSceneComputeInfoMSFT>(value);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_requestedFeatureCount);
  std::__cxx11::string::~string((string *)&oss_requestedFeatureCount);
  std::__cxx11::string::append((char *)prefix);
  local_450 = prefix;
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_requestedFeatureCount,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_requestedFeatureCount);
    std::__cxx11::string::~string((string *)&oss_requestedFeatureCount);
  }
  else {
    _oss_requestedFeatureCount = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_requestedFeatureCount);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_requestedFeatureCount);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)local_450);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_348,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_348,contents);
  std::__cxx11::string::~string((string *)&local_348);
  if (!bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&requestedfeaturecount_prefix,(string *)local_450);
  std::__cxx11::string::append((char *)&requestedfeaturecount_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_requestedFeatureCount);
  poVar4 = std::operator<<((ostream *)&oss_requestedFeatureCount,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&requestedfeaturecount_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_requestedFeatures_array);
  std::__cxx11::string::~string((string *)&oss_requestedFeatures_array);
  std::__cxx11::string::string((string *)&requestedfeatures_prefix,(string *)local_450);
  std::__cxx11::string::append((char *)&requestedfeatures_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_requestedFeatures_array);
  *(uint *)((long)auStack_190 + *(long *)(_oss_requestedFeatures_array + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_oss_requestedFeatures_array + -0x18)) & 0xffffffb5 |
       8;
  std::ostream::_M_insert<void_const*>(&oss_requestedFeatures_array);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[33],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [33])"const XrSceneComputeFeatureMSFT*",&requestedfeatures_prefix
             ,&consistency_prefix);
  std::__cxx11::string::~string((string *)&consistency_prefix);
  for (uVar6 = 0; uVar6 < value->requestedFeatureCount; uVar6 = uVar6 + 1) {
    std::__cxx11::string::string((string *)&consistency_prefix,(string *)&requestedfeatures_prefix);
    std::__cxx11::string::append((char *)&consistency_prefix);
    std::__cxx11::to_string(&bounds_prefix,(uint)uVar6);
    std::__cxx11::string::append((string *)&consistency_prefix);
    std::__cxx11::string::~string((string *)&bounds_prefix);
    std::__cxx11::string::append((char *)&consistency_prefix);
    std::__cxx11::to_string(&bounds_prefix,value->requestedFeatures[uVar6]);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[33],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [33])"const XrSceneComputeFeatureMSFT*",&consistency_prefix,
               &bounds_prefix);
    std::__cxx11::string::~string((string *)&bounds_prefix);
    std::__cxx11::string::~string((string *)&consistency_prefix);
  }
  std::__cxx11::string::string((string *)&consistency_prefix,(string *)local_450);
  std::__cxx11::string::append((char *)&consistency_prefix);
  std::__cxx11::to_string(&bounds_prefix,value->consistency);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[30],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [30])"XrSceneComputeConsistencyMSFT",&consistency_prefix,
             &bounds_prefix);
  std::__cxx11::string::~string((string *)&bounds_prefix);
  std::__cxx11::string::string((string *)&bounds_prefix,(string *)local_450);
  std::__cxx11::string::append((char *)&bounds_prefix);
  std::__cxx11::string::string((string *)(local_388 + 0x20),(string *)&bounds_prefix);
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_388;
  std::__cxx11::string::string((string *)gen_dispatch_table_00,"XrSceneBoundsMSFT",&local_451);
  bVar2 = ApiDumpOutputXrStruct
                    (gen_dispatch_table_00,&value->bounds,(string *)(local_388 + 0x20),
                     (string *)local_388,false,contents);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::string::~string((string *)(local_388 + 0x20));
  if (bVar2) {
    std::__cxx11::string::~string((string *)&bounds_prefix);
    std::__cxx11::string::~string((string *)&consistency_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_requestedFeatures_array);
    std::__cxx11::string::~string((string *)&requestedfeatures_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_requestedFeatureCount);
    std::__cxx11::string::~string((string *)&requestedfeaturecount_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrNewSceneComputeInfoMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string requestedfeaturecount_prefix = prefix;
        requestedfeaturecount_prefix += "requestedFeatureCount";
        std::ostringstream oss_requestedFeatureCount;
        oss_requestedFeatureCount << "0x" << std::hex << (value->requestedFeatureCount);
        contents.emplace_back("uint32_t", requestedfeaturecount_prefix, oss_requestedFeatureCount.str());
        std::string requestedfeatures_prefix = prefix;
        requestedfeatures_prefix += "requestedFeatures";
        std::ostringstream oss_requestedFeatures_array;
        oss_requestedFeatures_array << std::hex << reinterpret_cast<const void*>(value->requestedFeatures);
        contents.emplace_back("const XrSceneComputeFeatureMSFT*", requestedfeatures_prefix, oss_requestedFeatures_array.str());
        for (uint32_t value_requestedfeatures_inc = 0; value_requestedfeatures_inc < value->requestedFeatureCount; ++value_requestedfeatures_inc) {
            std::string requestedfeatures_array_prefix = requestedfeatures_prefix;
            requestedfeatures_array_prefix += "[";
            requestedfeatures_array_prefix += std::to_string(value_requestedfeatures_inc);
            requestedfeatures_array_prefix += "]";
            contents.emplace_back("const XrSceneComputeFeatureMSFT*", requestedfeatures_array_prefix, std::to_string(value->requestedFeatures[value_requestedfeatures_inc]));
        }
        std::string consistency_prefix = prefix;
        consistency_prefix += "consistency";
        contents.emplace_back("XrSceneComputeConsistencyMSFT", consistency_prefix, std::to_string(value->consistency));
        std::string bounds_prefix = prefix;
        bounds_prefix += "bounds";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->bounds, bounds_prefix, "XrSceneBoundsMSFT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}